

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

void __thiscall Clasp::Solver::Dirty::cleanup(Dirty *this,EVP_PKEY_CTX *ctx)

{
  Dirty *pDVar1;
  uint uVar2;
  const_iterator cVar3;
  long lVar4;
  ulong uVar5;
  long *in_RDX;
  long *plVar6;
  undefined8 *puVar7;
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var8;
  uint *puVar9;
  undefined8 *puVar10;
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var11;
  uint *puVar12;
  uint uVar13;
  undefined8 *puVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var18;
  undefined8 *puVar19;
  long *plVar20;
  key_type local_80;
  undefined8 *local_78;
  uint *local_70;
  long *local_68;
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_60;
  uint local_54;
  Dirty *local_50;
  long *local_48;
  uint *local_40;
  EVP_PKEY_CTX *local_38;
  
  p_Var18 = &(this->cons)._M_h;
  puVar9 = (uint *)(this->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_;
  uVar17 = (ulong)(this->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_;
  local_50 = this;
  local_48 = in_RDX;
  if (uVar17 != 0) {
    uVar13 = *(uint *)(ctx + 8);
    puVar12 = (uint *)(uVar17 + (long)puVar9);
    local_60 = p_Var18;
    local_54 = uVar13;
    local_40 = puVar12;
    local_38 = ctx;
    do {
      if (*puVar9 >> 1 < uVar13) {
        plVar6 = (long *)(*(long *)ctx + (ulong)(*puVar9 >> 1) * 0x18);
        uVar2 = *(uint *)((long)plVar6 + 0xc);
        uVar17 = (ulong)uVar2;
        if (7 < uVar17) {
          uVar5 = *(ulong *)*plVar6;
          if (((uVar5 & 1) != 0) &&
             (uVar5 = uVar5 & 0xfffffffffffffffe, *(ulong *)*plVar6 = uVar5, uVar5 != 0)) {
            puVar10 = (undefined8 *)*plVar6;
            puVar14 = (undefined8 *)((long)puVar10 + uVar17);
            local_68 = plVar6;
            if (0x1f < uVar2) {
              lVar15 = (ulong)(uVar2 >> 5) + 1;
              puVar7 = puVar10 + 2;
              local_70 = puVar9;
              do {
                puVar10 = puVar7;
                local_80 = (key_type)puVar10[-2];
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar10 = puVar10 + -2;
                  puVar9 = local_70;
                  goto LAB_0016d78f;
                }
                local_80 = (key_type)puVar10[-1];
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar10 = puVar10 + -1;
                  puVar9 = local_70;
                  goto LAB_0016d78f;
                }
                local_80 = (key_type)*puVar10;
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                puVar9 = local_70;
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) goto LAB_0016d78f;
                local_80 = (key_type)puVar10[1];
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                puVar9 = local_70;
                p_Var18 = local_60;
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar10 = puVar10 + 1;
                  goto LAB_0016d78f;
                }
                lVar15 = lVar15 + -1;
                uVar17 = uVar17 - 0x20;
                puVar7 = puVar10 + 4;
              } while (1 < lVar15);
              puVar10 = puVar10 + 2;
            }
            lVar15 = (long)uVar17 >> 3;
            puVar7 = puVar14;
            if (lVar15 == 1) {
LAB_0016d74c:
              local_80 = (key_type)*puVar10;
              cVar3 = std::
                      _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::find(p_Var18,&local_80);
              if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                  (__node_type *)0x0) goto LAB_0016d78f;
            }
            else {
              if (lVar15 == 2) {
LAB_0016d728:
                local_80 = (key_type)*puVar10;
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                    (__node_type *)0x0) {
                  puVar10 = puVar10 + 1;
                  goto LAB_0016d74c;
                }
              }
              else {
                if (lVar15 != 3) goto LAB_0016d7c7;
                local_80 = (key_type)*puVar10;
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                    (__node_type *)0x0) {
                  puVar10 = puVar10 + 1;
                  goto LAB_0016d728;
                }
              }
LAB_0016d78f:
              puVar7 = puVar10;
              puVar19 = puVar10;
              if (puVar10 != puVar14) {
                while (puVar19 = puVar19 + 1, puVar7 = puVar10, puVar19 != puVar14) {
                  local_80 = (key_type)*puVar19;
                  cVar3 = std::
                          _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          ::find(p_Var18,&local_80);
                  if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                      (__node_type *)0x0) {
                    *puVar10 = *puVar19;
                    puVar10 = puVar10 + 1;
                  }
                }
              }
            }
LAB_0016d7c7:
            *(int *)((long)local_68 + 0xc) = (int)puVar7 - (int)*local_68;
            ctx = local_38;
            puVar12 = local_40;
            plVar6 = local_68;
            uVar13 = local_54;
          }
        }
        uVar17 = (ulong)*(uint *)(plVar6 + 2);
        uVar2 = *(uint *)(plVar6 + 1) & 0x7fffffff;
        if (0xf < uVar2 - *(uint *)(plVar6 + 2)) {
          uVar5 = *(ulong *)(*plVar6 + -0x10 + (ulong)uVar2);
          if (((uVar5 & 1) != 0) &&
             (uVar5 = uVar5 & 0xfffffffffffffffe, *(ulong *)(*plVar6 + -0x10 + (ulong)uVar2) = uVar5
             , uVar5 != 0)) {
            lVar15 = *plVar6;
            uVar5 = (ulong)(*(uint *)(plVar6 + 1) & 0x7fffffff);
            local_78 = (undefined8 *)(lVar15 + uVar17);
            lVar4 = uVar5 - uVar17;
            local_68 = plVar6;
            if (0 < lVar4 >> 6) {
              lVar16 = -uVar17;
              lVar4 = (lVar4 >> 6) + 1;
              local_70 = puVar9;
              do {
                local_80 = *(key_type *)(lVar15 + -0x10 + uVar5);
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar14 = (undefined8 *)(lVar15 + uVar5);
                  puVar9 = local_70;
                  goto LAB_0016d9c2;
                }
                local_80 = *(key_type *)(lVar15 + -0x20 + uVar5);
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar14 = (undefined8 *)(lVar15 + uVar5 + -0x10);
                  puVar9 = local_70;
                  goto LAB_0016d9c2;
                }
                local_80 = *(key_type *)(lVar15 + -0x30 + uVar5);
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar14 = (undefined8 *)(lVar15 + uVar5 + -0x20);
                  puVar9 = local_70;
                  goto LAB_0016d9c2;
                }
                local_80 = *(key_type *)(lVar15 + -0x40 + uVar5);
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                puVar9 = local_70;
                p_Var18 = local_60;
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar14 = (undefined8 *)(lVar15 + uVar5 + -0x30);
                  goto LAB_0016d9c2;
                }
                lVar15 = lVar15 + -0x40;
                lVar16 = lVar16 + -0x40;
                lVar4 = lVar4 + -1;
              } while (1 < lVar4);
              lVar4 = lVar16 + uVar5;
            }
            puVar14 = (undefined8 *)(lVar15 + uVar5);
            lVar4 = lVar4 >> 4;
            if (lVar4 == 1) {
LAB_0016d962:
              local_80 = (key_type)puVar14[-2];
              cVar3 = std::
                      _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::find(p_Var18,&local_80);
              if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                  (__node_type *)0x0) {
                puVar14 = local_78;
              }
LAB_0016d9c2:
              puVar10 = puVar14;
              if ((puVar14 != local_78) &&
                 (puVar7 = puVar14 + -2, puVar19 = puVar14, puVar7 != local_78)) {
                do {
                  local_80 = (key_type)puVar7[-2];
                  cVar3 = std::
                          _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          ::find(p_Var18,&local_80);
                  if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                      (__node_type *)0x0) {
                    puVar14 = puVar19 + -2;
                    *(undefined4 *)(puVar19 + -1) = *(undefined4 *)(puVar7 + -1);
                    puVar19[-2] = puVar7[-2];
                    puVar19 = puVar14;
                  }
                  puVar7 = puVar7 + -2;
                  puVar10 = puVar14;
                } while (puVar7 != local_78);
              }
            }
            else {
              if (lVar4 == 2) {
LAB_0016d944:
                local_80 = (key_type)puVar14[-2];
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                    (__node_type *)0x0) {
                  puVar14 = puVar14 + -2;
                  goto LAB_0016d962;
                }
                goto LAB_0016d9c2;
              }
              puVar10 = local_78;
              if (lVar4 == 3) {
                local_80 = (key_type)puVar14[-2];
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                    (__node_type *)0x0) {
                  puVar14 = puVar14 + -2;
                  goto LAB_0016d944;
                }
                goto LAB_0016d9c2;
              }
            }
            *(int *)(local_68 + 2) = (int)puVar10 - (int)*local_68;
            ctx = local_38;
            puVar12 = local_40;
            uVar13 = local_54;
          }
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar12);
    puVar9 = (uint *)(local_50->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>
                     .buf_;
  }
  uVar13 = (local_50->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.right_;
  uVar2 = *(uint *)&(local_50->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.
                    field_0x8 & 0x7fffffff;
  if (uVar2 != uVar13) {
    p_Var11 = (_Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)((ulong)uVar13 + (long)puVar9);
    p_Var8 = (_Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)((ulong)uVar2 + (long)puVar9);
    plVar6 = local_48;
    local_60 = p_Var11;
    do {
      uVar13 = *(uint *)((long)&p_Var8[-1]._M_single_bucket + 4);
      if (uVar13 < *(uint *)(plVar6 + 1)) {
        plVar20 = *(long **)(*plVar6 + 8 + (ulong)uVar13 * 0x10);
        uVar13 = *(uint *)(plVar20 + 1);
        uVar17 = (ulong)uVar13;
        if (uVar17 != 0) {
          uVar5 = *(ulong *)*plVar20;
          if (((uVar5 & 1) != 0) &&
             (uVar5 = uVar5 & 0xfffffffffffffffe, *(ulong *)*plVar20 = uVar5, uVar5 != 0)) {
            puVar14 = (undefined8 *)*plVar20;
            local_78 = puVar14 + uVar17;
            if (3 < uVar13) {
              lVar15 = (ulong)(uVar13 >> 2) + 1;
              lVar4 = uVar17 << 3;
              puVar10 = puVar14 + 2;
              local_68 = plVar20;
              do {
                puVar14 = puVar10;
                local_80 = (key_type)puVar14[-2];
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar14 = puVar14 + -2;
                  plVar20 = local_68;
                  goto LAB_0016dc31;
                }
                local_80 = (key_type)puVar14[-1];
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar14 = puVar14 + -1;
                  plVar20 = local_68;
                  goto LAB_0016dc31;
                }
                local_80 = (key_type)*puVar14;
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                plVar20 = local_68;
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) goto LAB_0016dc31;
                local_80 = (key_type)puVar14[1];
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                plVar20 = local_68;
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  puVar14 = puVar14 + 1;
                  goto LAB_0016dc31;
                }
                lVar15 = lVar15 + -1;
                lVar4 = lVar4 + -0x20;
                puVar10 = puVar14 + 4;
              } while (1 < lVar15);
              uVar17 = lVar4 >> 3;
              puVar14 = puVar14 + 2;
            }
            if (uVar17 == 1) {
LAB_0016dbef:
              local_80 = (key_type)*puVar14;
              cVar3 = std::
                      _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::find(p_Var18,&local_80);
              puVar10 = local_78;
              if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur !=
                  (__node_type *)0x0) goto LAB_0016dc31;
            }
            else {
              if (uVar17 == 2) {
LAB_0016dbcb:
                local_80 = (key_type)*puVar14;
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                    (__node_type *)0x0) {
                  puVar14 = puVar14 + 1;
                  goto LAB_0016dbef;
                }
              }
              else {
                puVar10 = local_78;
                if (uVar17 != 3) goto LAB_0016dc74;
                local_80 = (key_type)*puVar14;
                cVar3 = std::
                        _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(p_Var18,&local_80);
                if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                    (__node_type *)0x0) {
                  puVar14 = puVar14 + 1;
                  goto LAB_0016dbcb;
                }
              }
LAB_0016dc31:
              puVar10 = puVar14;
              if ((puVar14 != local_78) && (puVar7 = puVar14 + 1, puVar7 != local_78)) {
                do {
                  local_80 = (key_type)*puVar7;
                  cVar3 = std::
                          _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          ::find(p_Var18,&local_80);
                  if (cVar3.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur ==
                      (__node_type *)0x0) {
                    *puVar14 = *puVar7;
                    puVar14 = puVar14 + 1;
                  }
                  puVar7 = puVar7 + 1;
                  puVar10 = puVar14;
                } while (puVar7 != local_78);
              }
            }
LAB_0016dc74:
            *(uint *)(plVar20 + 1) =
                 *(uint *)(plVar20 + 1) -
                 (int)(((ulong)*(uint *)(plVar20 + 1) * 8 + *plVar20) - (long)puVar10 >> 3);
            plVar6 = local_48;
            p_Var11 = local_60;
          }
        }
      }
      p_Var8 = (_Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)((long)&p_Var8[-1]._M_single_bucket + 4);
    } while (p_Var8 != p_Var11);
    uVar2 = *(uint *)&(local_50->dirty).super_type.
                      super_left_right_rep<Clasp::Literal,_unsigned_int>.field_0x8 & 0x7fffffff;
  }
  pDVar1 = local_50;
  (local_50->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_ = 0;
  (local_50->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.right_ = uVar2;
  std::
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(p_Var18);
  pDVar1->last = (Constraint *)0x0;
  return;
}

Assistant:

void cleanup(Watches& watches, DecisionLevels& levels) {
		InSet inCons = { &cons };
		const uint32 maxId = (uint32)watches.size();
		for (DirtyList::left_iterator it = dirty.left_begin(), end = dirty.left_end(); it != end; ++it) {
			uint32 id = it->id();
			if (id >= maxId)
				continue;
			WatchList& wl = watches[id];
			if (wl.left_size() && test_and_clear(wl.left_begin()->head)) { wl.shrink_left(std::remove_if(wl.left_begin(), wl.left_end(), inCons)); }
			if (wl.right_size()&& test_and_clear(wl.right_begin()->con)) { wl.shrink_right(std::remove_if(wl.right_begin(), wl.right_end(), inCons)); }
		}
		ConstraintDB* db = 0;
		for (DirtyList::right_iterator it = dirty.right_begin(), end = dirty.right_end(); it != end; ++it) {
			if (*it < levels.size() && !(db = levels[*it].undo)->empty() && test_and_clear(*db->begin())) {
				db->erase(std::remove_if(db->begin(), db->end(), inCons), db->end());
			}
		}
		dirty.clear();
		cons.clear();
		last = 0;
	}